

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

void ** __thiscall Js::JavascriptStackWalker::GetCurrentArgv(JavascriptStackWalker *this)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  void *pvVar5;
  void **ppvVar6;
  byte local_32;
  byte local_31;
  void **argv;
  bool isNativeAddr;
  JavascriptStackWalker *this_local;
  
  bVar2 = IsJavascriptFrame(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x38a,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->interpreterFrame == (InterpreterStackFrame *)0x0) {
    if (this->prevNativeLibraryEntry != (Entry *)0x0) {
      pvVar5 = Amd64StackFrame::GetAddressOfReturnAddress(&this->currentFrame,false,true);
      bVar2 = AlignAndCheckAddressOfReturnAddressMatch(pvVar5,this->prevNativeLibraryEntry->addr);
      if (bVar2) goto LAB_00feac10;
    }
    scriptContext = this->scriptContext;
    pvVar5 = Amd64StackFrame::GetInstructionPointer(&this->currentFrame);
    BVar3 = JavascriptFunction::IsNativeAddress(scriptContext,pvVar5);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x38d,
                                  "(this->interpreterFrame != nullptr || (this->prevNativeLibraryEntry && AlignAndCheckAddressOfReturnAddressMatch(this->currentFrame.GetAddressOfReturnAddress(), this->prevNativeLibraryEntry->addr)) || JavascriptFunction::IsNativeAddress(this->scriptContext, (void*)this->currentFrame.GetInstructionPointer()))"
                                  ,
                                  "this->interpreterFrame != nullptr || (this->prevNativeLibraryEntry && AlignAndCheckAddressOfReturnAddressMatch(this->currentFrame.GetAddressOfReturnAddress(), this->prevNativeLibraryEntry->addr)) || JavascriptFunction::IsNativeAddress(this->scriptContext, (void*)this->currentFrame.GetInstructionPointer())"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
LAB_00feac10:
  local_31 = 0;
  if (this->interpreterFrame == (InterpreterStackFrame *)0x0) {
    local_32 = 1;
    if (this->prevNativeLibraryEntry != (Entry *)0x0) {
      pvVar5 = Amd64StackFrame::GetAddressOfReturnAddress(&this->currentFrame,false,true);
      bVar2 = AlignAndCheckAddressOfReturnAddressMatch(pvVar5,this->prevNativeLibraryEntry->addr);
      local_32 = bVar2 ^ 0xff;
    }
    local_31 = local_32;
  }
  ppvVar6 = Amd64StackFrame::GetArgv(&this->currentFrame,(bool)(local_31 & 1),false);
  if (ppvVar6 == (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x392,"(argv)","argv");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return ppvVar6;
}

Assistant:

void ** JavascriptStackWalker::GetCurrentArgv() const
    {
        Assert(this->IsJavascriptFrame());
        Assert(this->interpreterFrame != nullptr ||
               (this->prevNativeLibraryEntry && AlignAndCheckAddressOfReturnAddressMatch(this->currentFrame.GetAddressOfReturnAddress(), this->prevNativeLibraryEntry->addr)) ||
               JavascriptFunction::IsNativeAddress(this->scriptContext, (void*)this->currentFrame.GetInstructionPointer()));

        bool isNativeAddr = (this->interpreterFrame == nullptr) &&
                            (!this->prevNativeLibraryEntry || !AlignAndCheckAddressOfReturnAddressMatch(this->currentFrame.GetAddressOfReturnAddress(), this->prevNativeLibraryEntry->addr));
        void ** argv = currentFrame.GetArgv(isNativeAddr, false /*shouldCheckForNativeAddr*/);
        Assert(argv);
        return argv;
    }